

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O0

HPDF_Stream HPDF_FileReader_New(HPDF_MMgr mmgr,char *fname)

{
  HPDF_Error error;
  FILE *pFVar1;
  int *piVar2;
  FILE *fp;
  HPDF_Stream stream;
  char *fname_local;
  HPDF_MMgr mmgr_local;
  
  pFVar1 = fopen(fname,"rb");
  if (pFVar1 == (FILE *)0x0) {
    error = mmgr->error;
    piVar2 = __errno_location();
    HPDF_SetError(error,0x1017,(long)*piVar2);
    mmgr_local = (HPDF_MMgr)0x0;
  }
  else {
    mmgr_local = (HPDF_MMgr)HPDF_GetMem(mmgr,0x58);
    if (mmgr_local != (HPDF_MMgr)0x0) {
      HPDF_MemSet(mmgr_local,'\0',0x58);
      *(undefined4 *)&mmgr_local->error = 0x5354524d;
      *(undefined4 *)((long)&mmgr_local->error + 4) = 2;
      mmgr_local->free_fn = (HPDF_Free_Func)mmgr->error;
      mmgr_local->alloc_fn = (HPDF_Alloc_Func)mmgr;
      mmgr_local[1].error = (HPDF_Error)HPDF_FileReader_ReadFunc;
      mmgr_local[1].alloc_fn = HPDF_FileReader_SeekFunc;
      mmgr_local[1].mpool = (HPDF_MPool_Node_conflict)HPDF_FileStream_TellFunc;
      *(code **)&mmgr_local[1].buf_size = HPDF_FileStream_SizeFunc;
      mmgr_local[1].free_fn = HPDF_FileStream_FreeFunc;
      mmgr_local[2].error = (HPDF_Error)pFVar1;
    }
  }
  return (HPDF_Stream)mmgr_local;
}

Assistant:

HPDF_Stream
HPDF_FileReader_New  (HPDF_MMgr   mmgr,
                      const char  *fname)
{
    HPDF_Stream stream;
    HPDF_FILEP fp = HPDF_FOPEN (fname, "rb");

    HPDF_PTRACE((" HPDF_FileReader_New\n"));

    if (!fp) {
#ifdef UNDER_CE
        HPDF_SetError (mmgr->error, HPDF_FILE_OPEN_ERROR, GetLastError());
#else
        HPDF_SetError (mmgr->error, HPDF_FILE_OPEN_ERROR, errno);
#endif
        return NULL;
    }

    stream = (HPDF_Stream)HPDF_GetMem(mmgr, sizeof(HPDF_Stream_Rec));

    if (stream) {
        HPDF_MemSet(stream, 0, sizeof(HPDF_Stream_Rec));
        stream->sig_bytes = HPDF_STREAM_SIG_BYTES;
        stream->type = HPDF_STREAM_FILE;
        stream->error = mmgr->error;
        stream->mmgr = mmgr;
        stream->read_fn = HPDF_FileReader_ReadFunc;
        stream->seek_fn = HPDF_FileReader_SeekFunc;
        stream->tell_fn = HPDF_FileStream_TellFunc;
        stream->size_fn = HPDF_FileStream_SizeFunc;
        stream->free_fn = HPDF_FileStream_FreeFunc;
        stream->attr = fp;
    }

    return stream;
}